

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O1

bool __thiscall
FpgaIO::ReadRTL8211F_Register(FpgaIO *this,uint chan,uint phyAddr,uint regAddr,uint16_t *data)

{
  BasePort *pBVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  uint *puVar8;
  undefined8 uVar9;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  uint16_t *puVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  quadlet_t read_data;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint16_t *local_38;
  
  bVar4 = WaitRTL8211F_Idle(this,"ReadRTL8211F_Register",chan,0x14);
  if (bVar4) {
    uVar14 = (ulong)(chan << 8 | 0x40a0);
    pBVar1 = (this->super_BoardIO).port;
    iVar5 = (*pBVar1->_vptr_BasePort[0x24])(pBVar1,(ulong)(this->super_BoardIO).BoardId,uVar14);
    uVar13 = 0;
    if ((char)iVar5 != '\0') {
      local_48 = regAddr;
      local_38 = data;
      Amp1394_Sleep(0.001);
      uVar9 = 0;
      uVar10 = 0;
      do {
        local_44 = (uint)uVar10;
        do {
          local_40 = (uint)uVar9;
          do {
            puVar11 = local_38;
            uVar12 = local_44;
            if ((((~(byte)uVar9 | ~(byte)uVar10) & 1) == 0) || (uVar13 == 0x14)) {
              if ((local_40 & 1) == 0) {
                plVar6 = &std::cout;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ReadRTL8211F_Register timeout waiting for data, read ",0x35);
                *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                     *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) &
                     0xffffffb5 | 8;
                puVar11 = local_38;
                uVar12 = local_44;
LAB_001084ed:
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
                lVar2 = *(long *)poVar7;
                lVar3 = *(long *)(lVar2 + -0x18);
                *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 2
                ;
                std::ios::widen((char)*(undefined8 *)(lVar2 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
              }
              else if ((local_44 & 1) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"ReadRTL8211F_Register regAddr mismatch, expected "
                           ,0x31);
                *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                     *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) &
                     0xffffffb5 | 8;
                plVar6 = (long *)std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)plVar6,", received ",0xb);
                goto LAB_001084ed;
              }
              *puVar11 = (uint16_t)local_4c;
              uVar13 = (uint)(((byte)local_40 & (byte)uVar12) != 0);
              goto LAB_00108546;
            }
            uVar13 = uVar13 + 1;
            pBVar1 = (this->super_BoardIO).port;
            puVar8 = &local_4c;
            iVar5 = (*pBVar1->_vptr_BasePort[0x23])
                              (pBVar1,(ulong)(this->super_BoardIO).BoardId,uVar14,&local_4c);
          } while ((char)iVar5 == '\0');
          bVar4 = (local_4c & 0x7000000) == 0;
          uVar9 = CONCAT71((int7)((ulong)puVar8 >> 8),bVar4);
        } while (!bVar4);
        local_3c = local_4c >> 0x10 & 0x1f;
        uVar10 = CONCAT71((int7)((ulong)extraout_RDX >> 8),local_3c == local_48);
      } while( true );
    }
  }
  else {
    uVar13 = 0;
  }
LAB_00108546:
  return SUB41(uVar13,0);
}

Assistant:

bool FpgaIO::ReadRTL8211F_Register(unsigned int chan, unsigned int phyAddr, unsigned int regAddr, uint16_t &data)
{
    // Should have firmware/hardware checks
    // Wait for FPGA mdio interface to be idle
    if (!WaitRTL8211F_Idle("ReadRTL8211F_Register", chan, 20))
        return false;
    nodeaddr_t address = 0x40a0 | (chan << 8);
    // Format: 0110 PPPP PRRR RRXX X(16), where P indicates phyAddr, R indicates regAddr, X is don't care (0)
    uint32_t write_data = 0x60000000 | ((phyAddr&0x1f) << 23) | ((regAddr&0x1f) << 18);
    if (!port->WriteQuadlet(BoardId, address, write_data))
        return false;
    // Read data is not valid unless FPGA mdio interface is in idle state. For most interfaces (e.g., Firewire,
    // Ethernet), this will already be the case, but the Zynq EMIO mmap interface is fast so some waiting is needed.
    // First, wait 1 millisecond
    Amp1394_Sleep(0.001);
    // Now, loop up to 20 times until mdio interface is idle and register address matches
    quadlet_t read_data;
    unsigned int regAddrRead;
    bool isIdle = false;
    bool regAddrMatch = false;
    unsigned int i = 0;
    while (!(isIdle && regAddrMatch) && (i++ < 20)) {
        if (port->ReadQuadlet(BoardId, address, read_data)) {
            isIdle = ((read_data&0x07000000) == 0);
            if (isIdle) {
                regAddrRead = (read_data & 0x001f0000)>>16;
                regAddrMatch = (regAddrRead == regAddr);
            }
        }
    }
    if (!isIdle) {
        std::cout << "ReadRTL8211F_Register timeout waiting for data, read " << std::hex
                  << read_data << std::dec << std::endl;
    }
    else if (!regAddrMatch) {
        std::cout << "ReadRTL8211F_Register regAddr mismatch, expected " << std::hex
                  << regAddr << ", received " << regAddrRead << std::dec << std::endl;
    }
    // Set data even if error, since it could be correct and caller may not check return value
    data = static_cast<uint16_t>(read_data & 0x0000ffff);
    return (isIdle & regAddrMatch);
}